

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O2

bool __thiscall QToolBarLayout::layoutActions(QToolBarLayout *this,QSize *size)

{
  char cVar1;
  long lVar2;
  long *plVar3;
  QToolBarItem *pQVar4;
  Representation RVar5;
  byte bVar6;
  bool bVar7;
  int spacer;
  int iVar8;
  Orientation OVar9;
  Representation RVar10;
  Representation RVar11;
  Representation RVar12;
  LayoutDirection direction;
  int iVar13;
  QWidget *pQVar14;
  QStyle *pQVar15;
  pointer pQVar16;
  ulong uVar17;
  int *piVar18;
  parameter_type t;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  QWidgetAction *this_00;
  undefined4 extraout_var_01;
  Representation RVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  int i;
  ulong uVar24;
  int j;
  long lVar25;
  QList<QWidget_*> *this_01;
  byte bVar26;
  long lVar27;
  Representation RVar28;
  long lVar29;
  long lVar30;
  int iVar31;
  int iVar32;
  long in_FS_OFFSET;
  QMargins QVar33;
  int local_17c;
  byte local_178;
  int local_174;
  int local_160;
  int local_15c;
  int local_144;
  int local_140;
  int local_13c;
  int local_130;
  int local_128;
  QRect local_110;
  QArrayDataPointer<QLayoutStruct> local_100;
  undefined1 local_e8 [16];
  ulong local_d8;
  undefined1 local_c8 [16];
  ulong local_b8;
  QRect local_a8;
  QStyleOptionToolBar opt;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->dirty == true) {
    updateGeomArray(this);
  }
  local_a8.x1.m_i = 0;
  local_a8.y1.m_i = 0;
  local_a8.y2.m_i = (*size).ht.m_i + -1;
  local_a8.x2.m_i = (*size).wd.m_i + -1;
  local_c8 = (undefined1  [16])0x0;
  local_b8 = 0;
  local_e8 = (undefined1  [16])0x0;
  local_d8 = 0;
  pQVar14 = QLayout::parentWidget(&this->super_QLayout);
  pQVar14 = &QtPrivate::qobject_cast_helper<QToolBar*,QObject>(&pQVar14->super_QObject)->
             super_QWidget;
  local_17c = 0;
  if (pQVar14 != (QWidget *)0x0) {
    pQVar15 = QWidget::style(pQVar14);
    opt._80_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionToolBar::QStyleOptionToolBar(&opt);
    (**(code **)(*(long *)pQVar14 + 0x1a0))(pQVar14,&opt);
    bVar7 = movable(this);
    if (bVar7) {
      local_17c = (**(code **)(*(long *)pQVar15 + 0xe0))(pQVar15,0x35,&opt,pQVar14);
    }
    QVar33 = QLayout::contentsMargins(&this->super_QLayout);
    spacer = (**(code **)(*(long *)&this->super_QLayout + 0x60))(this);
    iVar8 = (**(code **)(*(long *)pQVar15 + 0xe0))(pQVar15,0x39,&opt,pQVar14);
    OVar9 = QToolBar::orientation((QToolBar *)pQVar14);
    bVar7 = OVar9 == Horizontal;
    iVar21 = local_a8.y2.m_i - local_a8.y1.m_i;
    if (bVar7) {
      iVar21 = local_a8.x2.m_i - local_a8.x1.m_i;
    }
    RVar10 = QVar33.m_top.m_i;
    RVar11 = QVar33.m_left.m_i;
    RVar12.m_i = RVar10.m_i;
    if (bVar7) {
      RVar12.m_i = RVar11.m_i;
    }
    RVar19.m_i = QVar33.m_bottom.m_i.m_i;
    if (bVar7) {
      RVar19.m_i = QVar33.m_right.m_i.m_i;
    }
    iVar21 = (iVar21 + 1) - (RVar12.m_i + local_17c + RVar19.m_i);
    if (iVar21 < 1) {
      local_17c = 0;
    }
    else {
      if (this->popupMenu != (QMenu *)0x0) {
        QMenu::clear(this->popupMenu);
      }
      uVar24 = (ulong)local_a8._0_8_ >> 0x20;
      if (OVar9 == Vertical) {
        uVar24 = local_a8._0_8_;
      }
      RVar12.m_i = QVar33.m_bottom.m_i.m_i;
      RVar19.m_i = RVar11.m_i;
      RVar5.m_i = RVar10.m_i;
      if (OVar9 == Vertical) {
        RVar12.m_i = QVar33.m_right.m_i.m_i;
        RVar19.m_i = RVar10.m_i;
        RVar5.m_i = RVar11.m_i;
      }
      local_160 = RVar19.m_i + (int)uVar24;
      if (OVar9 != Horizontal) {
        RVar10.m_i = RVar11.m_i;
      }
      iVar32 = RVar10.m_i + local_17c;
      local_130 = 0;
      local_17c = 0;
      bVar26 = 1;
      iVar13 = 0;
      do {
        lVar29 = (long)iVar13;
        if ((this->items).d.size <= lVar29) break;
        local_100.d = (this->geomArray).d.d;
        local_100.ptr = (this->geomArray).d.ptr;
        local_100.size = (this->geomArray).d.size;
        if (local_100.d != (Data *)0x0) {
          LOCK();
          ((local_100.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_100.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        lVar27 = lVar29 * 8;
        lVar23 = lVar29 << 5;
        local_15c = 0;
        local_144 = 0;
        local_128 = -1;
        local_140 = 0;
        local_13c = 0;
        local_178 = 0;
        lVar25 = lVar27;
        local_174 = iVar13;
        for (lVar30 = lVar29; lVar30 < (this->items).d.size; lVar30 = lVar30 + 1) {
          pQVar16 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_100);
          if ((&pQVar16->empty)[lVar25 * 4] == false) {
            iVar31 = spacer;
            if (local_140 == 0) {
              iVar31 = 0;
            }
            pQVar16 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_100);
            iVar31 = iVar31 + local_144 + (&pQVar16->minimumSize)[lVar25];
            if ((local_128 != -1) && (iVar21 < iVar31)) {
              if (local_130 == 0) {
                local_17c = 1;
              }
              if ((1 < local_140) && (iVar21 < local_144 + iVar8 + spacer)) {
                local_174 = local_128;
              }
              break;
            }
            iVar20 = local_15c;
            if ((this->super_QLayout).super_QLayoutItem.field_0xc == '\x01') {
              uVar17 = (**(code **)(**(long **)((long)(this->items).d.ptr + lVar25) + 0x10))();
              uVar24 = uVar17 >> 0x20;
              if (OVar9 == Vertical) {
                uVar24 = uVar17;
              }
              iVar20 = (int)uVar24;
              if ((int)uVar24 < local_15c) {
                iVar20 = local_15c;
              }
            }
            local_15c = iVar20;
            bVar6 = local_178 & 1;
            local_178 = 1;
            if (bVar6 == 0) {
              pQVar16 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_100);
              local_178 = (&pQVar16->expansive)[lVar25 * 4];
            }
            pQVar16 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_100);
            bVar7 = (&pQVar16->expansive)[lVar25 * 4];
            pQVar16 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_100);
            if (bVar7 == true) {
              piVar18 = &pQVar16[lVar30].maximumSize;
            }
            else {
              piVar18 = (int *)((long)&pQVar16->sizeHint +
                               lVar23 + (ulong)(0 < (&pQVar16->stretch)[lVar25]) * 8);
            }
            local_13c = local_13c + spacer + *piVar18;
            local_140 = local_140 + 1;
            local_144 = iVar31;
            local_128 = local_174;
          }
          local_174 = local_174 + 1;
          lVar25 = lVar25 + 8;
          lVar23 = lVar23 + 0x20;
        }
        lVar25 = (long)local_174;
        pQVar16 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_100);
        pQVar16[lVar25].sizeHint = 0;
        pQVar16 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_100);
        pQVar16[lVar25].maximumSize = 0xffffff;
        pQVar16 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_100);
        pQVar16[lVar25].minimumSize = 0;
        pQVar16 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_100);
        pQVar16[lVar25].expansive = true;
        pQVar16 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_100);
        pQVar16[lVar25].stretch = 0;
        pQVar16 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_100);
        pQVar16[lVar25].empty = true;
        if (((local_178 & 1) != 0) && (iVar21 - local_13c != 0 && local_13c <= iVar21)) {
          pQVar16 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_100);
          pQVar16[lVar25].maximumSize = iVar21 - local_13c;
          local_178 = 0;
        }
        iVar31 = 0;
        if (local_17c != 0) {
          iVar31 = iVar8 + spacer;
        }
        qGeomCalc((QList<QLayoutStruct> *)&local_100,iVar13,
                  ((byte)~local_178 & 1) + (local_174 - iVar13),0,iVar21 - iVar31,spacer);
        iVar13 = 0;
        if (OVar9 == Vertical) {
          iVar13 = local_160;
        }
        for (; lVar29 < lVar25; lVar29 = lVar29 + 1) {
          plVar3 = *(long **)((long)(this->items).d.ptr + lVar27);
          pQVar16 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_100);
          if ((&pQVar16->empty)[lVar27 * 4] == true) {
            lVar30 = (**(code **)(*plVar3 + 0x68))(plVar3);
            if ((*(byte *)(*(long *)(lVar30 + 0x20) + 10) & 1) == 0) {
              t = (parameter_type)(**(code **)(*plVar3 + 0x68))(plVar3);
              this_01 = (QList<QWidget_*> *)local_e8;
LAB_004744dc:
              QList<QWidget_*>::append(this_01,t);
            }
          }
          else {
            pQVar16 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_100);
            iVar31 = (&pQVar16->pos)[lVar27] + iVar32;
            RVar28.m_i = local_160;
            if (OVar9 == Vertical) {
              RVar28.m_i = iVar31;
            }
            pQVar16 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_100);
            local_110.x1.m_i = iVar13;
            if (OVar9 == Horizontal) {
              RVar28.m_i = local_160;
              local_110.x1.m_i = iVar31;
            }
            iVar31 = (&pQVar16->size)[lVar27];
            iVar20 = -1;
            if (OVar9 == Horizontal) {
              iVar20 = iVar31;
            }
            iVar22 = local_15c;
            if ((this->super_QLayout).super_QLayoutItem.field_0xc == '\0') {
              iVar22 = local_a8.y2.m_i - local_a8.y1.m_i;
              if (OVar9 == Vertical) {
                iVar22 = local_a8.x2.m_i - local_a8.x1.m_i;
              }
              iVar22 = (iVar22 - (RVar12.m_i + RVar5.m_i)) + 1;
            }
            if (OVar9 != Vertical) {
              iVar31 = iVar22;
              iVar22 = iVar20;
            }
            local_110.y1.m_i = RVar28.m_i;
            local_110.x2.m_i = local_110.x1.m_i + -1 + iVar22;
            local_110.y2.m_i = iVar31 + RVar28.m_i + -1;
            if (OVar9 == Horizontal) {
              pQVar14 = QLayout::parentWidget(&this->super_QLayout);
              direction = QWidget::layoutDirection(pQVar14);
              local_110 = QStyle::visualRect(direction,&local_a8,&local_110);
            }
            (**(code **)(*plVar3 + 0x30))(plVar3,&local_110);
            lVar30 = (**(code **)(*plVar3 + 0x68))(plVar3);
            if ((*(byte *)(*(long *)(lVar30 + 0x20) + 10) & 1) != 0) {
              t = (parameter_type)(**(code **)(*plVar3 + 0x68))(plVar3);
              this_01 = (QList<QWidget_*> *)local_c8;
              goto LAB_004744dc;
            }
          }
          lVar27 = lVar27 + 8;
        }
        cVar1 = (this->super_QLayout).super_QLayoutItem.field_0xc;
        if (cVar1 == '\0') {
          for (; lVar25 < (this->items).d.size; lVar25 = lVar25 + 1) {
            pQVar4 = (this->items).d.ptr[lVar25];
            iVar13 = (*(pQVar4->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[0xd])(pQVar4)
            ;
            if ((*(byte *)(*(long *)(CONCAT44(extraout_var,iVar13) + 0x20) + 10) & 1) == 0) {
              iVar13 = (*(pQVar4->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[0xd])
                                 (pQVar4);
              QList<QWidget_*>::append
                        ((QList<QWidget_*> *)local_e8,
                         (parameter_type)CONCAT44(extraout_var_00,iVar13));
            }
            if (this->popupMenu != (QMenu *)0x0) {
              this_00 = QtPrivate::qobject_cast_helper<QWidgetAction*,QObject>
                                  ((QObject *)pQVar4->action);
              if (this_00 != (QWidgetAction *)0x0) {
                pQVar14 = QWidgetAction::defaultWidget(this_00);
                iVar13 = (*(pQVar4->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[0xd])
                                   (pQVar4);
                if (pQVar14 == (QWidget *)CONCAT44(extraout_var_01,iVar13)) goto LAB_004745a6;
              }
              QWidget::addAction(&this->popupMenu->super_QWidget,pQVar4->action);
              bVar26 = 0;
            }
LAB_004745a6:
          }
        }
        else {
          local_160 = local_160 + spacer + local_15c;
          local_130 = local_130 + 1;
        }
        QArrayDataPointer<QLayoutStruct>::~QArrayDataPointer(&local_100);
        iVar13 = local_174;
      } while (cVar1 != '\0');
      QWidget::setEnabled((QWidget *)this->extension,
                          (bool)(~bVar26 & 1 | this->popupMenu == (QMenu *)0x0));
      for (uVar24 = 0; uVar24 < local_b8; uVar24 = uVar24 + 1) {
        QWidget::show(*(QWidget **)(local_c8._8_8_ + uVar24 * 8));
      }
      for (uVar24 = 0; uVar24 < local_d8; uVar24 = uVar24 + 1) {
        QWidget::hide(*(QWidget **)(local_e8._8_8_ + uVar24 * 8));
      }
    }
    QStyleOption::~QStyleOption(&opt.super_QStyleOption);
  }
  QArrayDataPointer<QWidget_*>::~QArrayDataPointer((QArrayDataPointer<QWidget_*> *)local_e8);
  QArrayDataPointer<QWidget_*>::~QArrayDataPointer((QArrayDataPointer<QWidget_*> *)local_c8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return SUB41(local_17c,0);
  }
  __stack_chk_fail();
}

Assistant:

bool QToolBarLayout::layoutActions(const QSize &size)
{
    if (dirty)
        updateGeomArray();

    QRect rect(0, 0, size.width(), size.height());

    QList<QWidget*> showWidgets, hideWidgets;

    QToolBar *tb = qobject_cast<QToolBar*>(parentWidget());
    if (!tb)
        return false;
    QStyle *style = tb->style();
    QStyleOptionToolBar opt;
    tb->initStyleOption(&opt);
    const int handleExtent = movable()
            ? style->pixelMetric(QStyle::PM_ToolBarHandleExtent, &opt, tb) : 0;
    const QMargins margins = contentsMargins();
    const int spacing = this->spacing();
    const int extensionExtent = style->pixelMetric(QStyle::PM_ToolBarExtensionExtent, &opt, tb);
    Qt::Orientation o = tb->orientation();
    bool extensionMenuContainsOnlyWidgetActions = true;

    int space = pick(o, rect.size()) - pick(o, margins) - handleExtent;
    if (space <= 0)
        return false;  // nothing to do.

    if (popupMenu)
        popupMenu->clear();

    bool ranOutOfSpace = false;
    int rows = 0;
    int rowPos = perp(o, rect.topLeft()) + perp(o, QSize(margins.top(), margins.left()));
    int i = 0;
    while (i < items.size()) {
        QList<QLayoutStruct> a = geomArray;

        int start = i;
        int size = 0;
        int prev = -1;
        int rowHeight = 0;
        int count = 0;
        int maximumSize = 0;
        bool expansiveRow = false;
        for (; i < items.size(); ++i) {
            if (a[i].empty)
                continue;

            int newSize = size + (count == 0 ? 0 : spacing) + a[i].minimumSize;
            if (prev != -1 && newSize > space) {
                if (rows == 0)
                    ranOutOfSpace = true;
                // do we have to move the previous item to the next line to make space for
                // the extension button?
                if (count > 1 && size + spacing + extensionExtent > space)
                    i = prev;
                break;
            }

            if (expanded)
                rowHeight = qMax(rowHeight, perp(o, items.at(i)->sizeHint()));
            expansiveRow = expansiveRow || a[i].expansive;
            size = newSize;
            maximumSize += spacing + (a[i].expansive ? a[i].maximumSize : a[i].smartSizeHint());
            prev = i;
            ++count;
        }

        // stretch at the end
        a[i].sizeHint = 0;
        a[i].maximumSize = QWIDGETSIZE_MAX;
        a[i].minimumSize = 0;
        a[i].expansive = true;
        a[i].stretch = 0;
        a[i].empty = true;

        if (expansiveRow && maximumSize < space) {
            expansiveRow = false;
            a[i].maximumSize = space - maximumSize;
        }

        qGeomCalc(a, start, i - start + (expansiveRow ? 0 : 1), 0,
                    space - (ranOutOfSpace ? (extensionExtent + spacing) : 0),
                    spacing);

        for (int j = start; j < i; ++j) {
            QToolBarItem *item = items.at(j);

            if (a[j].empty) {
                if (!item->widget()->isHidden())
                    hideWidgets << item->widget();
                continue;
            }

            QPoint pos;
            rpick(o, pos) = pick(o, QSize(margins.top(), margins.left())) + handleExtent + a[j].pos;
            rperp(o, pos) = rowPos;
            QSize size;
            rpick(o, size) = a[j].size;
            if (expanded)
                rperp(o, size) = rowHeight;
            else
                rperp(o, size) = perp(o, rect.size()) - perp(o, margins);
            QRect r(pos, size);

            if (o == Qt::Horizontal)
                r = QStyle::visualRect(parentWidget()->layoutDirection(), rect, r);

            item->setGeometry(r);

            if (item->widget()->isHidden())
                showWidgets << item->widget();
        }

        if (!expanded) {
            for (int j = i; j < items.size(); ++j) {
                QToolBarItem *item = items.at(j);
                if (!item->widget()->isHidden())
                    hideWidgets << item->widget();
                if (popupMenu) {
                    if (!defaultWidgetAction(item)) {
                        popupMenu->addAction(item->action);
                        extensionMenuContainsOnlyWidgetActions = false;
                    }
                }
            }
            break;
        }

        rowPos += rowHeight + spacing;
        ++rows;
    }

    // if we are using a popup menu, not the expadning toolbar effect, we cannot move custom
    // widgets into the menu. If only custom widget actions are chopped off, the popup menu
    // is empty. So we show the little extension button to show something is chopped off,
    // but we make it disabled.
    extension->setEnabled(popupMenu == nullptr || !extensionMenuContainsOnlyWidgetActions);

    // we have to do the show/hide here, because it triggers more calls to setGeometry :(
    for (int i = 0; i < showWidgets.size(); ++i)
        showWidgets.at(i)->show();
    for (int i = 0; i < hideWidgets.size(); ++i)
        hideWidgets.at(i)->hide();

    return ranOutOfSpace;
}